

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * coda_strnstr(char *s,char *n,size_t len)

{
  size_t sVar1;
  ulong in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *x;
  char *w;
  char *en;
  char *es;
  size_t nsz;
  char *local_48;
  char *local_40;
  char *local_10;
  char *local_8;
  
  if ((in_RDI == (char *)0x0) || (*in_RDI == '\0')) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = in_RDI;
    if ((in_RSI != (char *)0x0) && (*in_RSI != '\0')) {
      sVar1 = strlen(in_RSI);
      if (in_RDX < sVar1) {
        local_8 = (char *)0x0;
      }
      else {
        for (local_10 = in_RDI; local_10 < in_RDI + in_RDX; local_10 = local_10 + 1) {
          if (*local_10 == *in_RSI) {
            local_48 = in_RSI;
            for (local_40 = local_10;
                (local_40 < in_RDI + in_RDX && local_48 < in_RSI + sVar1 && (*local_40 == *local_48)
                ); local_40 = local_40 + 1) {
              local_48 = local_48 + 1;
            }
            if (local_48 == in_RSI + sVar1) {
              return local_10;
            }
          }
        }
        local_8 = (char *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

char *coda_strnstr(const char *s, const char *n, size_t len)
{
	size_t nsz;
	const char *es, *en;
	const char *w;
	const char *x;

	if (!s || !*s) return NULL;
	if (!n || !*n) return (char *) s;

	if (len < (nsz = strlen(n))) return NULL;

	es = s + len;
	en = n + nsz;

	for (; s < es; ++s)
	{
		if (*s == *n)
		{
			for (w = s, x = n; w < es && x < en; ++w, ++x)
			{
				if (*w != *x) break;
			}

			if (x == en) return (char *) s;
		}
	}

	return NULL;
}